

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSimulationIslandManager.cpp
# Opt level: O1

void __thiscall
cbtSimulationIslandManager::findUnions
          (cbtSimulationIslandManager *this,cbtDispatcher *param_1,cbtCollisionWorld *colWorld)

{
  long lVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  long lVar6;
  long lVar7;
  long *plVar5;
  
  iVar3 = (*colWorld->m_broadphasePairCache->_vptr_cbtBroadphaseInterface[9])();
  plVar5 = (long *)CONCAT44(extraout_var,iVar3);
  uVar4 = (**(code **)(*plVar5 + 0x48))(plVar5);
  if (uVar4 != 0) {
    lVar6 = (**(code **)(*plVar5 + 0x28))(plVar5);
    if (0 < (int)uVar4) {
      lVar7 = 0;
      do {
        lVar1 = **(long **)(lVar6 + lVar7);
        if ((((lVar1 != 0) && ((*(byte *)(lVar1 + 0xe0) & 7) == 0)) &&
            (lVar2 = **(long **)(lVar6 + 8 + lVar7), lVar2 != 0)) &&
           ((*(byte *)(lVar2 + 0xe0) & 7) == 0)) {
          cbtUnionFind::unite(&this->m_unionFind,*(int *)(lVar1 + 0xe4),*(int *)(lVar2 + 0xe4));
        }
        lVar7 = lVar7 + 0x20;
      } while ((ulong)uVar4 << 5 != lVar7);
    }
  }
  return;
}

Assistant:

void cbtSimulationIslandManager::findUnions(cbtDispatcher* /* dispatcher */, cbtCollisionWorld* colWorld)
{
	{
		cbtOverlappingPairCache* pairCachePtr = colWorld->getPairCache();
		const int numOverlappingPairs = pairCachePtr->getNumOverlappingPairs();
		if (numOverlappingPairs)
		{
			cbtBroadphasePair* pairPtr = pairCachePtr->getOverlappingPairArrayPtr();

			for (int i = 0; i < numOverlappingPairs; i++)
			{
				const cbtBroadphasePair& collisionPair = pairPtr[i];
				cbtCollisionObject* colObj0 = (cbtCollisionObject*)collisionPair.m_pProxy0->m_clientObject;
				cbtCollisionObject* colObj1 = (cbtCollisionObject*)collisionPair.m_pProxy1->m_clientObject;

				if (((colObj0) && ((colObj0)->mergesSimulationIslands())) &&
					((colObj1) && ((colObj1)->mergesSimulationIslands())))
				{
					m_unionFind.unite((colObj0)->getIslandTag(),
									  (colObj1)->getIslandTag());
				}
			}
		}
	}
}